

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_part_type(exr_context_t f,exr_priv_part_t curpart)

{
  exr_result_t eVar1;
  int iVar2;
  char *in_RSI;
  exr_attr_string_t *in_RDI;
  exr_result_t rv;
  char *expectedtype;
  char *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(long *)(in_RSI + 0x70) != 0) {
    local_20 = (char *)0x0;
    if (*(char *)((long)&in_RDI->length + 3) != '\0') {
      if ((*(char *)((long)&in_RDI->alloc_size + 1) != '\0') || (1 < in_RDI[0xc].alloc_size)) {
        eVar1 = (*(code *)in_RDI[4].str)(in_RDI,0xe,"Multipart files cannot have the tiled bit set")
        ;
        return eVar1;
      }
      if ((*(int *)(in_RSI + 4) != 1) &&
         (in_RSI[4] = '\x01', in_RSI[5] = '\0', in_RSI[6] = '\0', in_RSI[7] = '\0',
         *(char *)((long)&in_RDI->alloc_size + 2) != '\0')) {
        eVar1 = (*(code *)in_RDI[4].str)
                          (in_RDI,0xe,
                           "attribute \'type\': Single part tiled flag set but not marked as tiled storage type"
                          );
        return eVar1;
      }
    }
    if (*(int *)(in_RSI + 4) == 0) {
      local_20 = "scanlineimage";
    }
    else if (*(int *)(in_RSI + 4) == 1) {
      local_20 = "tiledimage";
    }
    else if (*(int *)(in_RSI + 4) == 2) {
      local_20 = "deepscanline";
    }
    else if (*(int *)(in_RSI + 4) == 3) {
      local_20 = "deeptile";
    }
    if ((local_20 != (char *)0x0) &&
       (iVar2 = strcmp(*(char **)(*(long *)(*(long *)(in_RSI + 0x70) + 0x18) + 8),local_20),
       iVar2 != 0)) {
      if ((char)in_RDI->length == '\x01') {
        return 0xe;
      }
      if (*(char *)((long)&in_RDI->alloc_size + 2) != '\0') {
        eVar1 = (*(code *)in_RDI[4].str)
                          (in_RDI,0xe,
                           "attribute \'type\': Type should be \'%s\' but set to \'%s\', believing file flags"
                           ,local_20,*(undefined8 *)(*(long *)(*(long *)(in_RSI + 0x70) + 0x18) + 8)
                          );
        return eVar1;
      }
      eVar1 = exr_attr_string_set((exr_context_t)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI);
      if (eVar1 != 0) {
        eVar1 = (*(code *)in_RDI[4].str)
                          (in_RDI,0xe,
                           "attribute \'type\': Mismatch between file flags and type attribute, unable to fix"
                          );
        return eVar1;
      }
    }
  }
  if (*(int *)(in_RSI + 4) == 4) {
    eVar1 = (*(code *)in_RDI[4].str)(in_RDI,0xe,"Unable to determine data storage type for part");
  }
  else {
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

static exr_result_t
validate_part_type (exr_context_t f, exr_priv_part_t curpart)
{
    // TODO: there are probably more tests to add here...
    if (curpart->type)
    {
        const char *expectedtype = NULL;
        exr_result_t rv;

        // see if the type overwrote the storage mode
        if (f->is_singlepart_tiled)
        {
            if (f->is_multipart || f->num_parts > 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "Multipart files cannot have the tiled bit set");

            if (curpart->storage_mode != EXR_STORAGE_TILED)
            {
                curpart->storage_mode = EXR_STORAGE_TILED;

                if (f->strict_header)
                {
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Single part tiled flag set but not marked as tiled storage type");
                }
            }
        }

        if (curpart->storage_mode == EXR_STORAGE_SCANLINE)
            expectedtype = "scanlineimage";
        else if (curpart->storage_mode == EXR_STORAGE_TILED)
            expectedtype = "tiledimage";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
            expectedtype = "deepscanline";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
            expectedtype = "deeptile";

        if (expectedtype && 0 != strcmp (curpart->type->string->str, expectedtype))
        {
            if (f->mode == EXR_CONTEXT_WRITE) return EXR_ERR_INVALID_ATTR;

            if (f->strict_header)
            {
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "attribute 'type': Type should be '%s' but set to '%s', believing file flags",
                    expectedtype,
                    curpart->type->string->str);
            }
            else
            {
                /* C++ silently changed this */
                rv = exr_attr_string_set (
                    f, curpart->type->string, expectedtype);

                if (rv != EXR_ERR_SUCCESS)
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Mismatch between file flags and type attribute, unable to fix");
            }
        }
    }

    /* NB: we allow an 'unknown' storage type of EXR_STORAGE_UNKNOWN
     * for future proofing */
    if (curpart->storage_mode == EXR_STORAGE_LAST_TYPE)
    {
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Unable to determine data storage type for part");
    }

    return EXR_ERR_SUCCESS;
}